

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::emplaceRealloc<int>
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,pointer pos,int *args)

{
  pointer pCVar1;
  ulong uVar2;
  size_type sVar3;
  pointer pCVar4;
  ulong uVar5;
  uint uVar6;
  pointer ctx;
  int iVar7;
  int *piVar8;
  pointer pCVar9;
  long lVar10;
  long lVar11;
  
  if (this->len != 0xfffffffffffffff) {
    uVar5 = this->len + 1;
    uVar2 = this->cap;
    if (uVar5 < uVar2 * 2) {
      uVar5 = uVar2 * 2;
    }
    if (0xfffffffffffffff - uVar2 < uVar2) {
      uVar5 = 0xfffffffffffffff;
    }
    lVar11 = (long)pos - (long)this->data_;
    pCVar4 = (pointer)operator_new(uVar5 * 8);
    iVar7 = *args;
    *(undefined1 *)((long)pCVar4 + lVar11) = 1;
    *(int *)((long)pCVar4 + lVar11 + 4) = iVar7;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 1;
    ctx = this->data_;
    sVar3 = this->len;
    pCVar1 = ctx + sVar3;
    if (pCVar1 == pos) {
      if (sVar3 != 0) {
        iVar7 = 0;
        lVar10 = 0;
        do {
          (&pCVar4->constructed)[lVar10] = true;
          *(undefined4 *)((long)&pCVar4->value + lVar10) =
               *(undefined4 *)((long)&ctx->value + lVar10);
          *(undefined4 *)((long)&ctx->value + lVar10) = 0;
          lVar10 = lVar10 + 8;
          iVar7 = iVar7 + -1;
        } while (sVar3 << 3 != lVar10);
        (anonymous_namespace)::Constructable::numConstructorCalls =
             (anonymous_namespace)::Constructable::numConstructorCalls - iVar7;
        (anonymous_namespace)::Constructable::numMoveConstructorCalls =
             (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar7;
      }
    }
    else {
      if (ctx != pos) {
        iVar7 = 0;
        pCVar9 = pCVar4;
        do {
          pCVar9->constructed = true;
          pCVar9->value = ctx->value;
          ctx->value = 0;
          ctx = ctx + 1;
          pCVar9 = pCVar9 + 1;
          iVar7 = iVar7 + -1;
        } while (ctx != pos);
        (anonymous_namespace)::Constructable::numConstructorCalls =
             (anonymous_namespace)::Constructable::numConstructorCalls - iVar7;
        (anonymous_namespace)::Constructable::numMoveConstructorCalls =
             (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar7;
      }
      piVar8 = (int *)((long)pCVar4 + lVar11 + 0xc);
      ctx = (pointer)0x0;
      do {
        *(undefined1 *)(piVar8 + -1) = 1;
        *piVar8 = pos->value;
        pos->value = 0;
        pos = pos + 1;
        piVar8 = piVar8 + 2;
        uVar6 = (int)ctx - 1;
        ctx = (pointer)(ulong)uVar6;
      } while (pos != pCVar1);
      (anonymous_namespace)::Constructable::numConstructorCalls =
           (anonymous_namespace)::Constructable::numConstructorCalls - uVar6;
      (anonymous_namespace)::Constructable::numMoveConstructorCalls =
           (anonymous_namespace)::Constructable::numMoveConstructorCalls - uVar6;
    }
    cleanup(this,(EVP_PKEY_CTX *)ctx);
    this->len = this->len + 1;
    this->cap = uVar5;
    this->data_ = pCVar4;
    return (pointer)((long)pCVar4 + lVar11);
  }
  detail::throwLengthError();
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}